

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O1

void Imath_2_5::jacobiEigenSolver<double>
               (Matrix33<double> *A,Vec3<double> *S,Matrix33<double> *V,double tol)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  double *pdVar4;
  uint uVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_d8 [4];
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  V->x[0][0] = 0.0;
  V->x[0][1] = 0.0;
  V->x[1][1] = 0.0;
  V->x[1][2] = 0.0;
  V->x[2][0] = 0.0;
  V->x[2][1] = 0.0;
  V->x[0][2] = 0.0;
  V->x[1][0] = 0.0;
  V->x[0][0] = 1.0;
  V->x[1][1] = 1.0;
  V->x[2][2] = 1.0;
  lVar2 = 0;
  do {
    *(undefined8 *)((long)&S->x + lVar2) = *(undefined8 *)((long)A->x[0] + lVar2 * 4);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  local_68 = 0.0;
  uVar3 = 0;
  pdVar4 = (double *)A;
  do {
    if (uVar3 < 2) {
      lVar2 = 1;
      dVar11 = local_68;
      do {
        local_68 = ABS(pdVar4[lVar2]);
        if (ABS(pdVar4[lVar2]) <= dVar11) {
          local_68 = dVar11;
        }
        lVar1 = uVar3 + lVar2;
        lVar2 = lVar2 + 1;
        dVar11 = local_68;
      } while (lVar1 != 2);
    }
    uVar3 = uVar3 + 1;
    pdVar4 = pdVar4 + 4;
  } while (uVar3 != 3);
  local_68 = local_68 * tol;
  if ((local_68 != 0.0) || (NAN(local_68))) {
    uStack_60 = 0;
    uVar5 = 0;
    while( true ) {
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      local_d8[2] = 0.0;
      local_a8 = A->x[0][1];
      dVar11 = A->x[1][1] - A->x[0][0];
      local_48 = ABS(local_a8 + local_a8);
      local_58 = ABS(dVar11) * tol;
      uStack_40 = 0;
      uStack_50 = 0;
      if (local_48 <= local_58) {
        A->x[0][1] = 0.0;
      }
      else {
        dVar11 = dVar11 / (local_a8 + local_a8);
        dVar7 = dVar11 * dVar11 + 1.0;
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        dVar7 = *(double *)(&DAT_00110220 + (ulong)(dVar11 < 0.0) * 8) / (ABS(dVar11) + dVar7);
        dVar11 = dVar7 * dVar7 + 1.0;
        if (dVar11 < 0.0) {
          dVar11 = sqrt(dVar11);
        }
        else {
          dVar11 = SQRT(dVar11);
        }
        local_a8 = local_a8 * dVar7;
        dVar7 = dVar7 * (1.0 / dVar11);
        local_d8[0] = 0.0 - local_a8;
        local_d8[1] = local_a8 + 0.0;
        dVar12 = A->x[0][2];
        A->x[0][0] = A->x[0][0] - local_a8;
        dVar8 = dVar7 / (1.0 / dVar11 + 1.0);
        A->x[1][1] = local_a8 + A->x[1][1];
        A->x[0][1] = 0.0;
        dVar11 = A->x[1][2];
        A->x[0][2] = dVar12 - (dVar8 * dVar12 + dVar11) * dVar7;
        A->x[1][2] = (dVar12 - dVar8 * dVar11) * dVar7 + dVar11;
        lVar2 = 0;
        do {
          pdVar4 = (double *)((long)V->x[0] + lVar2);
          dVar11 = *pdVar4;
          dVar12 = pdVar4[1];
          pdVar4 = (double *)((long)V->x[0] + lVar2);
          *pdVar4 = (dVar8 * dVar11 + dVar12) * -dVar7 + dVar11;
          pdVar4[1] = (-dVar8 * dVar12 + dVar11) * dVar7 + dVar12;
          lVar2 = lVar2 + 0x18;
        } while (lVar2 != 0x48);
      }
      dVar11 = A->x[0][2];
      dVar7 = A->x[2][2] - A->x[0][0];
      local_a8 = ABS(dVar11 + dVar11);
      dVar12 = ABS(dVar7) * tol;
      uStack_a0 = 0;
      if (local_a8 <= dVar12) {
        A->x[0][2] = 0.0;
      }
      else {
        dVar7 = dVar7 / (dVar11 + dVar11);
        dVar8 = dVar7 * dVar7 + 1.0;
        local_98 = dVar11;
        if (dVar8 < 0.0) {
          uStack_b0 = 0;
          local_b8 = dVar7;
          dVar8 = sqrt(dVar8);
          dVar11 = local_b8;
        }
        else {
          dVar8 = SQRT(dVar8);
          dVar11 = dVar7;
        }
        dVar11 = *(double *)(&DAT_00110220 + (ulong)(dVar7 < 0.0) * 8) / (ABS(dVar11) + dVar8);
        dVar7 = dVar11 * dVar11 + 1.0;
        if (dVar7 < 0.0) {
          uStack_b0 = 0;
          local_b8 = dVar11;
          dVar7 = sqrt(dVar7);
          dVar11 = local_b8;
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        dVar8 = local_98 * dVar11;
        dVar11 = dVar11 * (1.0 / dVar7);
        dVar9 = dVar11 / (1.0 / dVar7 + 1.0);
        local_d8[0] = local_d8[0] - dVar8;
        local_d8[2] = dVar8 + 0.0;
        dVar7 = A->x[0][1];
        A->x[0][0] = A->x[0][0] - dVar8;
        A->x[2][2] = dVar8 + A->x[2][2];
        A->x[0][2] = 0.0;
        dVar8 = A->x[1][2];
        A->x[0][1] = dVar7 - (dVar9 * dVar7 + dVar8) * dVar11;
        A->x[1][2] = (dVar7 - dVar9 * dVar8) * dVar11 + dVar8;
        lVar2 = 0x10;
        do {
          dVar7 = *(double *)((long)(V->x + -1) + 8 + lVar2);
          dVar8 = *(double *)((long)V->x[0] + lVar2);
          *(double *)((long)(V->x + -1) + 8 + lVar2) = (dVar9 * dVar7 + dVar8) * -dVar11 + dVar7;
          *(double *)((long)V->x[0] + lVar2) = (-dVar9 * dVar8 + dVar7) * dVar11 + dVar8;
          lVar2 = lVar2 + 0x18;
        } while (lVar2 != 0x58);
      }
      dVar11 = A->x[1][2];
      dVar9 = A->x[2][2] - A->x[1][1];
      dVar7 = ABS(dVar11 + dVar11);
      dVar8 = ABS(dVar9) * tol;
      if (dVar7 <= dVar8) {
        A->x[1][2] = 0.0;
      }
      else {
        dVar9 = dVar9 / (dVar11 + dVar11);
        dVar10 = dVar9 * dVar9 + 1.0;
        uStack_90 = 0;
        uStack_b0 = 0;
        local_b8 = dVar8;
        local_98 = dVar7;
        local_70 = dVar11;
        if (dVar10 < 0.0) {
          uStack_80 = 0;
          local_88 = dVar9;
          dVar10 = sqrt(dVar10);
          dVar11 = local_88;
        }
        else {
          dVar10 = SQRT(dVar10);
          dVar11 = dVar9;
        }
        dVar11 = *(double *)(&DAT_00110220 + (ulong)(dVar9 < 0.0) * 8) / (ABS(dVar11) + dVar10);
        dVar7 = dVar11 * dVar11 + 1.0;
        if (dVar7 < 0.0) {
          uStack_80 = 0;
          local_88 = dVar11;
          dVar7 = sqrt(dVar7);
          dVar11 = local_88;
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        dVar8 = local_70 * dVar11;
        dVar11 = dVar11 * (1.0 / dVar7);
        dVar9 = dVar11 / (1.0 / dVar7 + 1.0);
        local_d8[1] = local_d8[1] - dVar8;
        local_d8[2] = local_d8[2] + dVar8;
        A->x[1][1] = A->x[1][1] - dVar8;
        A->x[2][2] = dVar8 + A->x[2][2];
        A->x[1][2] = 0.0;
        dVar7 = A->x[0][1];
        dVar8 = A->x[0][2];
        A->x[0][1] = (dVar9 * dVar7 + dVar8) * -dVar11 + dVar7;
        A->x[0][2] = (-dVar9 * dVar8 + dVar7) * dVar11 + dVar8;
        lVar2 = 8;
        do {
          pdVar4 = (double *)((long)V->x[0] + lVar2);
          dVar7 = *pdVar4;
          dVar8 = pdVar4[1];
          pdVar4 = (double *)((long)V->x[0] + lVar2);
          *pdVar4 = (dVar9 * dVar7 + dVar8) * -dVar11 + dVar7;
          pdVar4[1] = (-dVar9 * dVar8 + dVar7) * dVar11 + dVar8;
          lVar2 = lVar2 + 0x18;
          dVar7 = local_98;
          dVar8 = local_b8;
        } while (lVar2 != 0x50);
      }
      lVar2 = 0;
      do {
        dVar11 = *(double *)((long)local_d8 + lVar2) + *(double *)((long)&S->x + lVar2);
        *(double *)((long)&S->x + lVar2) = dVar11;
        *(double *)((long)A->x[0] + lVar2 * 4) = dVar11;
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x18);
      if ((bool)(~(local_58 < local_48 || dVar12 < local_a8) & dVar7 <= dVar8)) break;
      dVar11 = 0.0;
      uVar3 = 0;
      pdVar4 = (double *)A;
      do {
        if (uVar3 < 2) {
          lVar2 = 1;
          do {
            dVar7 = ABS(pdVar4[lVar2]);
            if (ABS(pdVar4[lVar2]) <= dVar11) {
              dVar7 = dVar11;
            }
            dVar11 = dVar7;
            lVar1 = uVar3 + lVar2;
            lVar2 = lVar2 + 1;
          } while (lVar1 != 2);
        }
        uVar3 = uVar3 + 1;
        pdVar4 = pdVar4 + 4;
      } while (uVar3 != 3);
      if (dVar11 <= local_68) {
        return;
      }
      bVar6 = 0x12 < uVar5;
      uVar5 = uVar5 + 1;
      if (bVar6) {
        return;
      }
    }
  }
  return;
}

Assistant:

void
jacobiEigenSolver (Matrix33<T>& A,
                   Vec3<T>& S,
                   Matrix33<T>& V,
                   const T tol)
{
    V.makeIdentity();
    for(int i = 0; i < 3; ++i) {
        S[i] = A[i][i];
    }

    const int maxIter = 20;  // In case we get really unlucky, prevents infinite loops
    const T absTol = tol * maxOffDiagSymm (A);  // Tolerance is in terms of the maximum
    if (absTol != 0)                        // _off-diagonal_ entry.
    {
        int numIter = 0;
        do
        {
            // Z is for accumulating small changes (h) to diagonal entries
            // of A for one sweep. Adding h's directly to A might cause
            // a cancellation effect when h is relatively very small to 
            // the corresponding diagonal entry of A and 
            // this will increase numerical errors
            Vec3<T> Z(0, 0, 0);
            ++numIter;
            bool changed = jacobiRotation<0, 1, 2> (A, V, Z, tol);
            changed = jacobiRotation<0, 2, 1> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 2, 0> (A, V, Z, tol) || changed;
            // One sweep passed. Add accumulated changes (Z) to singular values (S)
            // Update diagonal elements of A for better accuracy as well.
            for(int i = 0; i < 3; ++i) {
                A[i][i] = S[i] += Z[i];
            }
            if (!changed)
                break;
        } while (maxOffDiagSymm(A) > absTol && numIter < maxIter);
    }
}